

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void entityDeclDebug(void *ctx,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                    xmlChar *content)

{
  xmlChar *nullstr;
  xmlChar *content_local;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  int type_local;
  xmlChar *name_local;
  void *ctx_local;
  
  systemId_local = publicId;
  if (publicId == (xmlChar *)0x0) {
    systemId_local = "(null)";
  }
  content_local = systemId;
  if (systemId == (xmlChar *)0x0) {
    content_local = "(null)";
  }
  nullstr = content;
  if (content == (xmlChar *)0x0) {
    nullstr = "(null)";
  }
  callbacks = callbacks + 1;
  if (quiet == 0) {
    fprintf((FILE *)SAXdebug,"SAX.entityDecl(%s, %d, %s, %s, %s)\n",name,(ulong)(uint)type,
            systemId_local,content_local,nullstr);
  }
  return;
}

Assistant:

static void
entityDeclDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, int type,
          const xmlChar *publicId, const xmlChar *systemId, xmlChar *content)
{
const xmlChar *nullstr = BAD_CAST "(null)";
    /* not all libraries handle printing null pointers nicely */
    if (publicId == NULL)
        publicId = nullstr;
    if (systemId == NULL)
        systemId = nullstr;
    if (content == NULL)
        content = (xmlChar *)nullstr;
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.entityDecl(%s, %d, %s, %s, %s)\n",
            name, type, publicId, systemId, content);
}